

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCounters.cpp
# Opt level: O1

void __thiscall QueryCounters::add(QueryCounters *this,QueryCounters *other)

{
  duration *pdVar1;
  
  (this->ors_).count_ = (this->ors_).count_ + (other->ors_).count_;
  pdVar1 = &(this->ors_).duration_;
  pdVar1->__r = pdVar1->__r + (other->ors_).duration_.__r;
  (this->ands_).count_ = (this->ands_).count_ + (other->ands_).count_;
  pdVar1 = &(this->ands_).duration_;
  pdVar1->__r = pdVar1->__r + (other->ands_).duration_.__r;
  (this->reads_).count_ = (this->reads_).count_ + (other->reads_).count_;
  pdVar1 = &(this->reads_).duration_;
  pdVar1->__r = pdVar1->__r + (other->reads_).duration_.__r;
  (this->uniq_reads_).count_ = (this->uniq_reads_).count_ + (other->uniq_reads_).count_;
  pdVar1 = &(this->uniq_reads_).duration_;
  pdVar1->__r = pdVar1->__r + (other->uniq_reads_).duration_.__r;
  (this->minofs_).count_ = (this->minofs_).count_ + (other->minofs_).count_;
  pdVar1 = &(this->minofs_).duration_;
  pdVar1->__r = pdVar1->__r + (other->minofs_).duration_.__r;
  return;
}

Assistant:

void QueryCounter::add(const QueryCounter &other) {
    count_ += other.count_;
    duration_ += other.duration_;
}